

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O1

void cursespp::SchemaOverlay::ShowListOverlay
               (string *title,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *items,string *defaultValue,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *cb)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  int iVar4;
  ListOverlay *pLVar5;
  pointer pbVar6;
  OverlayStack *this;
  long lVar7;
  ulong index;
  ulong uVar8;
  shared_ptr<StringListAdapter> stringAdapter;
  value_type current;
  shared_ptr<cursespp::ListOverlay> dialog;
  StringListAdapter *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  _Any_data local_d0;
  _Manager_type local_c0;
  undefined8 uStack_b8;
  StringListAdapter *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  ListOverlay *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string *local_90;
  ILayoutPtr local_88;
  IScrollAdapterPtr local_78;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *local_68;
  string *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_e0 = (StringListAdapter *)0x0;
  local_90 = defaultValue;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StringListAdapter,std::allocator<StringListAdapter>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_d8,&local_e0,(allocator<StringListAdapter> *)&local_d0,items);
  pLVar5 = (ListOverlay *)operator_new(0x360);
  ListOverlay::ListOverlay(pLVar5);
  local_a0 = pLVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cursespp::ListOverlay*>
            (&local_98,pLVar5);
  local_68 = cb;
  local_60 = title;
  std::__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cursespp::ListOverlay,cursespp::ListOverlay>
            ((__shared_ptr<cursespp::ListOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_a0,pLVar5);
  pbVar6 = (items->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((items->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar6) {
    index = 0;
  }
  else {
    lVar7 = 8;
    uVar8 = 0;
    index = 0;
    do {
      lVar1 = *(long *)((long)pbVar6 + lVar7 + -8);
      local_d0._M_unused._M_object = &local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,lVar1,
                 *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar7) + lVar1);
      uVar3 = index;
      if (((local_d0._8_8_ == local_90->_M_string_length) && (uVar3 = uVar8, local_d0._8_8_ != 0))
         && (iVar4 = bcmp(local_d0._M_unused._M_object,(local_90->_M_dataplus)._M_p,local_d0._8_8_),
            uVar3 = index, iVar4 == 0)) {
        uVar3 = uVar8;
      }
      index = uVar3;
      if ((_Manager_type *)local_d0._M_unused._0_8_ != &local_c0) {
        operator_delete(local_d0._M_unused._M_object,(ulong)(local_c0 + 1));
      }
      uVar8 = uVar8 + 1;
      pbVar6 = (items->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < (ulong)((long)(items->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
  }
  local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_e0;
  local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_d8._M_pi;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
    }
  }
  pLVar5 = ListOverlay::SetAdapter(local_a0,&local_78);
  pLVar5 = ListOverlay::SetTitle(pLVar5,local_60);
  iVar4 = Screen::GetWidth();
  pLVar5 = ListOverlay::SetWidth(pLVar5,(int)((float)iVar4 * 0.8));
  pLVar5 = ListOverlay::SetSelectedIndex(pLVar5,index);
  pLVar5 = ListOverlay::SetAutoDismiss(pLVar5,true);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_d0,local_68);
  local_b0 = local_e0;
  local_a8 = local_d8._M_pi;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x30);
  p_Var2 = local_a8;
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_b8;
  if (local_c0 != (_Manager_type)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_d0._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_d0._8_8_;
    *(_Manager_type *)((long)local_58._M_unused._0_8_ + 0x10) = local_c0;
    local_c0 = (_Manager_type)0x0;
    uStack_b8 = 0;
  }
  *(StringListAdapter **)((long)local_58._M_unused._0_8_ + 0x20) = local_b0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x28) = 0;
  local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x28) = p_Var2
  ;
  local_b0 = (StringListAdapter *)0x0;
  pcStack_40 = std::
               _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(cursespp::ListOverlay_*,_std::shared_ptr<cursespp::IScrollAdapter>,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:266:13)>
             ::_M_manager;
  ListOverlay::SetItemSelectedCallback(pLVar5,(ItemSelectedCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_c0 != (_Manager_type)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this = App::Overlays();
  local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_a0->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_a0 == (ListOverlay *)0x0) {
    local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_98._M_pi;
  if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this,&local_88);
  if (local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
  }
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowListOverlay(
    const std::string& title,
    std::vector<std::string>& items,
    const std::string defaultValue,
    std::function<void(std::string)> cb)
{
    auto stringAdapter = std::make_shared<StringListAdapter>(items);
    std::shared_ptr<ListOverlay> dialog(new ListOverlay());

    size_t index = 0;
    for (size_t i = 0; i < items.size(); i++) {
        auto current = items[i];
        if (current == defaultValue) {
            index = i;
        }
    }

    dialog->SetAdapter(stringAdapter)
        .SetTitle(title)
        .SetWidth(overlayWidth())
        .SetSelectedIndex(index)
        .SetAutoDismiss(true)
        .SetItemSelectedCallback(
            [cb, stringAdapter](ListOverlay* overlay, IScrollAdapterPtr adapter, size_t index) {
                if (cb) {
                    cb(stringAdapter->At(index));
                }
            });

    cursespp::App::Overlays().Push(dialog);
}